

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matte.cpp
# Opt level: O3

RGBColor __thiscall pm::Matte::areaLightShade(Matte *this,ShadeRecord *sr)

{
  undefined8 uVar1;
  World *pWVar2;
  long *plVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  char cVar6;
  ulong uVar7;
  long in_RDX;
  long lVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  RGBColor RVar18;
  RGBColor *L;
  Vector3 wi;
  float fStack_b4;
  undefined1 local_98 [16];
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  float local_70;
  undefined8 local_6c;
  float local_64;
  Matte *local_60;
  undefined8 local_58;
  float local_50;
  undefined1 local_48 [16];
  
  fVar13 = (sr->ray).o.y;
  uVar1 = *(undefined8 *)&(sr->normal).z;
  fVar14 = (float)uVar1;
  fVar10 = (sr->ray).o.z;
  local_60 = this;
  (**(code **)(**(long **)(*(long *)(in_RDX + 0x60) + 0x70) + 0x18))(&local_78);
  local_98._4_4_ = 0;
  local_98._0_4_ = fVar10 * fVar14 * local_70;
  local_98._8_8_ = 0;
  fStack_b4 = (float)((ulong)uVar1 >> 0x20);
  local_88._4_4_ = fVar13 * fVar14 * (float)((ulong)local_78 >> 0x20);
  local_88._0_4_ = fVar14 * fStack_b4 * (float)local_78;
  _fStack_80 = 0;
  lVar8 = *(long *)(*(long *)(in_RDX + 0x60) + 0x80) - *(long *)(*(long *)(in_RDX + 0x60) + 0x78);
  if (lVar8 != 0) {
    uVar7 = 0;
    uVar9 = 1;
    do {
      plVar3 = *(long **)(*(long *)(*(long *)(in_RDX + 0x60) + 0x78) + uVar7 * 8);
      (**(code **)(*plVar3 + 0x10))(&local_58,plVar3);
      fVar13 = *(float *)(in_RDX + 0x30) * local_50 +
               *(float *)(in_RDX + 0x28) * (float)local_58 +
               (float)((ulong)local_58 >> 0x20) * *(float *)(in_RDX + 0x2c);
      fStack_b4 = local_50;
      if (0.0 < fVar13) {
        local_48 = ZEXT416((uint)fVar13);
        if (*(char *)((long)plVar3 + 0xc) == '\x01') {
          local_78 = *(undefined8 *)(in_RDX + 0x10);
          local_70 = *(float *)(in_RDX + 0x18);
          local_6c = local_58;
          local_64 = local_50;
          cVar6 = (**(code **)(*plVar3 + 0x20))(plVar3,&local_78);
          if (cVar6 != '\0') goto LAB_0010d244;
        }
        fVar13 = *(float *)&sr->tracer;
        pWVar2 = sr->world;
        fVar15 = SUB84(pWVar2,0);
        fVar10 = *(float *)((long)&sr->tracer + 4);
        (**(code **)(*plVar3 + 0x18))(&local_78,plVar3);
        fVar14 = (float)local_78;
        uVar7 = (ulong)local_78 >> 0x20;
        fVar10 = fVar15 * fVar10 * 0.31830987 * local_70;
        fVar11 = (float)(**(code **)(*plVar3 + 0x28))(plVar3);
        fVar14 = (float)local_48._0_4_ *
                 fVar11 * fVar14 * fVar15 * (float)((ulong)pWVar2 >> 0x20) * 0.31830987;
        fVar15 = (float)local_48._0_4_ * fVar11 * (float)uVar7 * fVar13 * fVar15 * 0.31830987;
        fVar16 = (float)local_48._0_4_ * fVar11 * 0.0;
        fVar17 = (float)local_48._0_4_ * fVar11 * 0.0;
        fStack_b4 = fVar10 * fVar11 * (float)local_48._0_4_;
        fVar13 = (float)(**(code **)(*plVar3 + 0x30))(plVar3);
        fStack_b4 = fStack_b4 / fVar13;
        auVar5._4_4_ = fVar15;
        auVar5._0_4_ = fVar14;
        auVar5._8_4_ = fVar16;
        auVar5._12_4_ = fVar17;
        auVar12._4_4_ = fVar13;
        auVar12._0_4_ = fVar13;
        auVar12._8_4_ = fVar13;
        auVar12._12_4_ = fVar13;
        auVar12 = divps(auVar5,auVar12);
        local_88._4_4_ = (float)local_88._4_4_ + auVar12._4_4_;
        local_88._0_4_ = (float)local_88._0_4_ + auVar12._0_4_;
        fStack_80 = fStack_80 + auVar12._8_4_;
        fStack_7c = fStack_7c + auVar12._12_4_;
        local_98._0_4_ = (float)local_98._0_4_ + fStack_b4;
      }
LAB_0010d244:
      bVar4 = uVar9 < (ulong)(lVar8 >> 3);
      uVar7 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar4);
  }
  (local_60->super_Material)._vptr_Material = (_func_int **)local_88;
  (local_60->super_Material).type_ = (Type)local_98._0_8_;
  RVar18.b = fStack_b4;
  RVar18.r = (float)local_98._0_4_;
  RVar18.g = (float)local_98._4_4_;
  return RVar18;
}

Assistant:

RGBColor Matte::areaLightShade(ShadeRecord &sr) const
{
	const Vector3 wo = -sr.ray.d;
	RGBColor L = ambientBrdf_.rho(sr, wo) * sr.world.ambientLight().L(sr);
	const size_t numLights = sr.world.lights().size();

	for (unsigned int i = 0; i < numLights; i++)
	{
		const Light &light = *sr.world.lights()[i];
		const Vector3 wi = light.direction(sr);
		const float nDotWi = dot(sr.normal, wi);

		if (nDotWi > 0.0f)
		{
			bool inShadow = false;

			if (light.castShadows())
			{
				Ray shadowRay(sr.hitPoint, wi);
				inShadow = light.inShadow(shadowRay, sr);
			}

			if (inShadow == false)
				L += diffuseBrdf_.f(sr, wo, wi) * light.L(sr) * light.G(sr) * nDotWi / light.pdf(sr);
		}
	}

	return L;
}